

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testselectionwidget.cpp
# Opt level: O2

void Undo_Redo_Selective(Am_Slot_Key allowed_slot,Am_Slot_Key method_slot,char *prompt_str)

{
  Am_Handler_Selective_Undo_Method_Type *pAVar1;
  Am_Selective_New_Allowed_Method_Type *pAVar2;
  Am_Selective_Allowed_Method_Type *pAVar3;
  char cVar4;
  bool bVar5;
  Am_Value *pAVar6;
  ostream *poVar7;
  undefined8 in_RCX;
  undefined6 in_register_00000032;
  char *pcVar8;
  Am_Object this;
  anon_union_8_8_ea4c8939_for_value in_R8;
  int iVar9;
  Am_Value AVar10;
  Am_Value AVar11;
  Am_Object cmd;
  Am_Object local_140;
  uint local_134;
  Am_Object new_cmd;
  int which;
  Am_Value_List l;
  Am_String s;
  Am_Handler_Selective_Undo_Method method;
  Am_Object local_f0;
  Am_Object local_e8;
  Am_Object local_e0;
  Am_Object local_d8;
  Am_Value current_selection;
  Am_Object local_c0;
  Am_Object local_b8;
  Am_Value obj_modified;
  Am_Object last_command;
  Am_Value local_98;
  Am_Value local_88;
  Am_Selective_New_Allowed_Method new_allowed_method;
  Am_Selective_Allowed_Method allowed_method;
  undefined1 local_50 [16];
  Am_Value local_40;
  
  local_134 = (uint)CONCAT62(in_register_00000032,method_slot);
  last_command.data = (Am_Object_Data *)0x0;
  Am_Value_List::Am_Value_List(&l);
  pAVar6 = (Am_Value *)Am_Object::Get(0x5670,0xc5);
  Am_Value_List::operator=(&l,pAVar6);
  s.data = (Am_String_Data *)0x0;
  cmd.data = (Am_Object_Data *)0x0;
  new_cmd.data = (Am_Object_Data *)0x0;
  current_selection.type = 0;
  current_selection.value.wrapper_value = (Am_Wrapper *)0x0;
  obj_modified.type = 0;
  obj_modified.value.wrapper_value = (Am_Wrapper *)0x0;
  allowed_method.from_wrapper = (Am_Method_Wrapper *)0x0;
  allowed_method.Call = (Am_Selective_Allowed_Method_Type *)0x0;
  new_allowed_method.from_wrapper = (Am_Method_Wrapper *)0x0;
  new_allowed_method.Call = (Am_Selective_New_Allowed_Method_Type *)0x0;
  if ((short)local_134 == 0x14a) {
    pAVar6 = (Am_Value *)Am_Object::Get(0x5670,(ulong)allowed_slot);
    Am_Selective_New_Allowed_Method::operator=(&new_allowed_method,pAVar6);
    pAVar6 = (Am_Value *)Am_Object::Get(0x5678,0x169);
    Am_Value::operator=(&current_selection,pAVar6);
  }
  else {
    pAVar6 = (Am_Value *)Am_Object::Get(0x5670,(ulong)allowed_slot);
    Am_Selective_Allowed_Method::operator=(&allowed_method,pAVar6);
  }
  Am_Value_List::Start();
  iVar9 = 0;
  while( true ) {
    cVar4 = Am_Value_List::Last();
    if (cVar4 != '\0') break;
    pAVar6 = (Am_Value *)Am_Value_List::Get();
    Am_Object::operator=(&cmd,pAVar6);
    pAVar6 = (Am_Value *)Am_Object::Get((ushort)&cmd,0x150);
    Am_String::operator=(&s,pAVar6);
    pAVar6 = (Am_Value *)Am_Object::Get((ushort)&cmd,0x16d);
    Am_Value::operator=(&obj_modified,pAVar6);
    poVar7 = (ostream *)std::ostream::operator<<(&std::cout,iVar9);
    poVar7 = std::operator<<(poVar7," ");
    poVar7 = (ostream *)operator<<(poVar7,&s);
    poVar7 = std::operator<<(poVar7," on ");
    poVar7 = (ostream *)operator<<(poVar7,&obj_modified);
    poVar7 = std::operator<<(poVar7," (cmd = ");
    poVar7 = (ostream *)operator<<(poVar7,&cmd);
    std::operator<<(poVar7,") ");
    pAVar3 = allowed_method.Call;
    pAVar2 = new_allowed_method.Call;
    if ((short)local_134 == 0x14a) {
      Am_Object::Am_Object(&local_b8,&cmd);
      Am_Value::Am_Value(&local_40,&current_selection);
      Am_Value::Am_Value((Am_Value *)local_50,(Am_Value *)&Am_No_Value);
      this.data = (Am_Object_Data *)&local_b8;
      AVar10.value.wrapper_value = (Am_Wrapper *)local_50;
      AVar10._0_8_ = &local_40;
      AVar11.value.wrapper_value = in_R8.wrapper_value;
      AVar11._0_8_ = in_RCX;
      bVar5 = (*pAVar2)(this,AVar10,AVar11);
      Am_Value::~Am_Value((Am_Value *)local_50);
      Am_Value::~Am_Value(&local_40);
    }
    else {
      Am_Object::Am_Object(&local_c0,&cmd);
      this.data = (Am_Object_Data *)&local_c0;
      bVar5 = (*pAVar3)(this);
    }
    Am_Object::~Am_Object((Am_Object *)this.data);
    pcVar8 = "OK\n";
    if (bVar5 == false) {
      pcVar8 = "NOT OK\n";
    }
    std::operator<<((ostream *)&std::cout,pcVar8);
    Am_Value_List::Next();
    iVar9 = iVar9 + 1;
  }
  poVar7 = std::operator<<((ostream *)&std::cout,"--Type index of command to ");
  poVar7 = std::operator<<(poVar7,prompt_str);
  std::operator<<(poVar7," (or -1 to exit): ");
  std::ostream::flush();
  std::istream::operator>>((istream *)&std::cin,&which);
  if (-1 < which) {
    Am_Value_List::Start();
    for (iVar9 = 0; iVar9 < which; iVar9 = iVar9 + 1) {
      Am_Value_List::Next();
    }
    pAVar6 = (Am_Value *)Am_Value_List::Get();
    Am_Object::operator=(&cmd,pAVar6);
    if ((short)local_134 == 0x14a) {
      method.from_wrapper = (Am_Method_Wrapper *)0x0;
      method.Call = (Am_Handler_Selective_Undo_Method_Type *)0x0;
      pAVar6 = (Am_Value *)Am_Object::Get(0x5670,0x14a);
      Am_Handler_Selective_Repeat_New_Method::operator=
                ((Am_Handler_Selective_Repeat_New_Method *)&method,pAVar6);
      poVar7 = std::operator<<((ostream *)&std::cout,prompt_str);
      poVar7 = std::operator<<(poVar7," on cmd ");
      poVar7 = (ostream *)operator<<(poVar7,&cmd);
      poVar7 = std::operator<<(poVar7," method = ");
      poVar7 = (ostream *)operator<<(poVar7,(Am_Handler_Selective_Repeat_New_Method *)&method);
      poVar7 = std::operator<<(poVar7," new obj = ");
      poVar7 = (ostream *)operator<<(poVar7,&current_selection);
      std::endl<char,std::char_traits<char>>(poVar7);
      std::ostream::flush();
      pAVar1 = method.Call;
      Am_Object::Am_Object(&local_d8,&undo_handler);
      Am_Object::Am_Object(&local_e0,&cmd);
      Am_Value::Am_Value(&local_88,&current_selection);
      Am_Value::Am_Value(&local_98,(Am_Value *)&Am_No_Value);
      (*pAVar1)((Am_Object_Data *)&local_140,(Am_Object_Data *)&local_d8);
      Am_Object::operator=(&new_cmd,&local_140);
      Am_Object::~Am_Object(&local_140);
      Am_Value::~Am_Value(&local_98);
      Am_Value::~Am_Value(&local_88);
      Am_Object::~Am_Object(&local_e0);
      Am_Object::~Am_Object(&local_d8);
      poVar7 = std::operator<<((ostream *)&std::cout,"  new_cmd = ");
      poVar7 = (ostream *)operator<<(poVar7,&new_cmd);
      std::endl<char,std::char_traits<char>>(poVar7);
      std::ostream::flush();
    }
    else {
      method.from_wrapper = (Am_Method_Wrapper *)0x0;
      method.Call = (Am_Handler_Selective_Undo_Method_Type *)0x0;
      pAVar6 = (Am_Value *)Am_Object::Get(0x5670,(ulong)(local_134 & 0xffff));
      Am_Handler_Selective_Undo_Method::operator=(&method,pAVar6);
      poVar7 = std::operator<<((ostream *)&std::cout,prompt_str);
      poVar7 = std::operator<<(poVar7," on cmd ");
      poVar7 = (ostream *)operator<<(poVar7,&cmd);
      poVar7 = std::operator<<(poVar7," method = ");
      poVar7 = (ostream *)operator<<(poVar7,&method);
      std::endl<char,std::char_traits<char>>(poVar7);
      std::ostream::flush();
      pAVar1 = method.Call;
      Am_Object::Am_Object(&local_e8,&undo_handler);
      Am_Object::Am_Object(&local_f0,&cmd);
      (*pAVar1)((Am_Object_Data *)&local_140,(Am_Object_Data *)&local_e8);
      Am_Object::operator=(&new_cmd,&local_140);
      Am_Object::~Am_Object(&local_140);
      Am_Object::~Am_Object(&local_f0);
      Am_Object::~Am_Object(&local_e8);
      poVar7 = std::operator<<((ostream *)&std::cout,"  new_cmd = ");
      poVar7 = (ostream *)operator<<(poVar7,&new_cmd);
      std::endl<char,std::char_traits<char>>(poVar7);
      std::ostream::flush();
    }
  }
  Am_Value::~Am_Value(&obj_modified);
  Am_Value::~Am_Value(&current_selection);
  Am_Object::~Am_Object(&new_cmd);
  Am_Object::~Am_Object(&cmd);
  Am_String::~Am_String(&s);
  Am_Value_List::~Am_Value_List(&l);
  Am_Object::~Am_Object(&last_command);
  return;
}

Assistant:

void
Undo_Redo_Selective(Am_Slot_Key allowed_slot, Am_Slot_Key method_slot,
                    const char *prompt_str)
{
  Am_Object last_command;
  bool use_new = (method_slot == Am_SELECTIVE_REPEAT_ON_NEW_METHOD);
  Am_Value_List l;
  l = undo_handler.Get(Am_COMMAND);
  Am_String s;
  Am_Object cmd, new_cmd;
  Am_Selective_Allowed_Method allowed_method;
  Am_Selective_New_Allowed_Method new_allowed_method;
  Am_Value current_selection, obj_modified;
  if (use_new) {
    new_allowed_method = undo_handler.Get(allowed_slot);
    //get the selection
    current_selection = my_selection.Peek(Am_VALUE);
  } else
    allowed_method = undo_handler.Get(allowed_slot);

  bool allowed;
  int cnt;
  for (l.Start(), cnt = 0; !l.Last(); l.Next(), cnt++) {
    cmd = l.Get();
    s = cmd.Get(Am_LABEL);
    obj_modified = cmd.Peek(Am_OBJECT_MODIFIED);
    std::cout << cnt << " " << s << " on " << obj_modified << " (cmd = " << cmd
              << ") ";
    if (use_new)
      allowed = new_allowed_method.Call(cmd, current_selection, Am_No_Value);
    else
      allowed = allowed_method.Call(cmd);
    if (allowed)
      std::cout << "OK\n";
    else
      std::cout << "NOT OK\n";
  }
  std::cout << "--Type index of command to " << prompt_str
            << " (or -1 to exit): " << std::flush;
  int which;
  std::cin >> which;
  if (which < 0)
    return;
  for (l.Start(), cnt = 0; cnt < which; l.Next(), cnt++)
    ;
  cmd = l.Get();
  if (use_new) {
    Am_Handler_Selective_Repeat_New_Method method;
    method = undo_handler.Get(method_slot);
    std::cout << prompt_str << " on cmd " << cmd << " method = " << method
              << " new obj = " << current_selection << std::endl
              << std::flush;
    new_cmd = method.Call(undo_handler, cmd, current_selection, Am_No_Value);
    std::cout << "  new_cmd = " << new_cmd << std::endl << std::flush;
  } else {
    Am_Handler_Selective_Undo_Method method;
    method = undo_handler.Get(method_slot);
    std::cout << prompt_str << " on cmd " << cmd << " method = " << method
              << std::endl
              << std::flush;
    new_cmd = method.Call(undo_handler, cmd);
    std::cout << "  new_cmd = " << new_cmd << std::endl << std::flush;
  }
}